

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

TColor rgbToAnsi256(ImU32 col,bool doAlpha)

{
  byte in_SIL;
  uint in_EDI;
  float fVar1;
  double in_XMM0_Qa;
  undefined4 uVar5;
  double dVar2;
  double dVar3;
  double dVar4;
  TColor res;
  float scale;
  TColor a_1;
  TColor a;
  TColor b;
  TColor g;
  TColor r;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 uStack_5;
  undefined1 local_1;
  
  uVar5 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  local_a = (byte)in_EDI;
  local_b = (byte)(in_EDI >> 8);
  local_c = (byte)(in_EDI >> 0x10);
  uStack_5 = (byte)(in_EDI >> 0x18);
  if (((in_EDI & 0xff) == (uint)local_b) && (local_b == local_c)) {
    if ((in_SIL & 1) != 0) {
      local_a = (byte)(int)(((float)(in_EDI & 0xff) * (float)uStack_5) / 255.0);
    }
    if (local_a < 8) {
      local_1 = '\x10';
    }
    else if (local_a < 0xf9) {
      dVar2 = std::round((double)CONCAT44(uVar5,((float)(int)(local_a - 8) / 247.0) * 24.0));
      local_1 = (TColor)(int)(SUB84(dVar2,0) + 232.0);
    }
    else {
      local_1 = 0xe7;
    }
  }
  else {
    if ((in_SIL & 1) != 0) {
      fVar1 = (float)uStack_5 / 255.0;
      dVar2 = std::round((double)CONCAT44(uVar5,(float)(in_EDI & 0xff) * fVar1));
      local_a = (byte)(int)SUB84(dVar2,0);
      dVar2 = std::round((double)CONCAT44((int)((ulong)dVar2 >> 0x20),(float)local_b * fVar1));
      local_b = (byte)(int)SUB84(dVar2,0);
      in_XMM0_Qa = std::round((double)CONCAT44((int)((ulong)dVar2 >> 0x20),(float)local_c * fVar1));
      local_c = (byte)(int)SUB84(in_XMM0_Qa,0);
    }
    dVar2 = std::round((double)CONCAT44((int)((ulong)in_XMM0_Qa >> 0x20),
                                        ((float)local_a / 255.0) * 5.0));
    dVar3 = std::round((double)CONCAT44((int)((ulong)dVar2 >> 0x20),((float)local_b / 255.0) * 5.0))
    ;
    dVar4 = std::round((double)CONCAT44((int)((ulong)dVar3 >> 0x20),((float)local_c / 255.0) * 5.0))
    ;
    local_1 = (TColor)(int)(SUB84(dVar3,0) * 6.0 + SUB84(dVar2,0) * 36.0 + 16.0 + SUB84(dVar4,0));
  }
  return local_1;
}

Assistant:

inline ImTui::TColor rgbToAnsi256(ImU32 col, bool doAlpha) {
    ImTui::TColor r = col & 0x000000FF;
    ImTui::TColor g = (col & 0x0000FF00) >> 8;
    ImTui::TColor b = (col & 0x00FF0000) >> 16;

    if (r == g && g == b) {
        if (doAlpha) {
            ImTui::TColor a = (col & 0xFF000000) >> 24;
            r = (float(r)*a)/255.0f;
        }
        if (r < 8) {
            return 16;
        }

        if (r > 248) {
            return 231;
        }

        return std::round((float(r - 8) / 247) * 24) + 232;
    }

    if (doAlpha) {
        ImTui::TColor a = (col & 0xFF000000) >> 24;
        float scale = float(a)/255.0f;
        r = std::round(r*scale);
        g = std::round(g*scale);
        b = std::round(b*scale);
    }

    ImTui::TColor res = 16
        + (36 * std::round((float(r) / 255.0f) * 5.0f))
        + (6 * std::round((float(g) / 255.0f) * 5.0f))
        + std::round((float(b) / 255.0f) * 5.0f);

    return res;
}